

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

void curl_easy_cleanup(Curl_easy *data)

{
  sigpipe_ignore pipe_st;
  sigpipe_ignore local_b0;
  
  if (data != (Curl_easy *)0x0) {
    sigpipe_ignore(data,&local_b0);
    Curl_close(data);
    if (local_b0.no_signal == false) {
      sigaction(0xd,(sigaction *)&local_b0,(sigaction *)0x0);
    }
  }
  return;
}

Assistant:

void curl_easy_cleanup(struct Curl_easy *data)
{
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return;

  sigpipe_ignore(data, &pipe_st);
  Curl_close(data);
  sigpipe_restore(&pipe_st);
}